

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void * NULLC::AssertDerivedFrom(uint *derived,uint base)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_20;
  uint typeId;
  uint base_local;
  uint *derived_local;
  
  if (derived != (uint *)0x0) {
    local_20 = *derived;
    while (base != local_20) {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),local_20);
      if (pEVar1->baseType == 0) {
        pcVar2 = nullcGetTypeName(*derived);
        pcVar3 = nullcGetTypeName(base);
        nullcThrowError("ERROR: cannot convert from \'%s\' to \'%s\'",pcVar2,pcVar3);
        return derived;
      }
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),local_20);
      local_20 = pEVar1->baseType;
    }
  }
  return derived;
}

Assistant:

void* NULLC::AssertDerivedFrom(unsigned* derived, unsigned base)
{
	if(!derived)
		return derived;

	unsigned typeId = *derived;

	for(;;)
	{
		if(base == typeId)
			return derived;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	nullcThrowError("ERROR: cannot convert from '%s' to '%s'", nullcGetTypeName(*derived), nullcGetTypeName(base));
	return derived;
}